

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selector_table.cc
# Opt level: O3

BOOL anon_unknown.dwarf_207b5::selector_types_equal(char *t1,char *t2)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte bVar6;
  
  if (t2 == (char *)0x0 || t1 == (char *)0x0) {
    return t1 == t2;
  }
  do {
    if (*t1 == 0) {
      return '\x01';
    }
    if (*t2 == 0) {
      return '\x01';
    }
    pbVar4 = (byte *)skip_irrelevant_type_info(t1);
    pbVar5 = (byte *)skip_irrelevant_type_info(t2);
    bVar3 = *pbVar4;
    bVar2 = *pbVar5;
    if (bVar3 == 0x2a) {
      if (bVar2 == 0x2a) {
        bVar3 = 0x2a;
        bVar6 = 0x2a;
      }
      else {
        if (bVar2 != 0x5e) {
          return '\0';
        }
        bVar3 = pbVar5[1];
        if ((bVar3 | 0x20) != 99) {
          return '\0';
        }
        pbVar5 = pbVar5 + 1;
        bVar6 = 0x2a;
      }
    }
    else if (bVar2 == 0x2a) {
      if ((bVar3 != 0x5e) || (pbVar1 = pbVar4 + 1, (*pbVar1 | 0x20) != 99)) {
        return '\0';
      }
      pbVar4 = pbVar4 + 1;
      bVar3 = 0x2a;
      bVar6 = *pbVar1;
    }
    else {
      bVar6 = bVar3;
      if (bVar3 != bVar2) {
        return '\0';
      }
    }
    t1 = (char *)(pbVar4 + (bVar6 != 0));
    t2 = (char *)(pbVar5 + (bVar3 != 0));
  } while( true );
}

Assistant:

static BOOL selector_types_equal(const char *t1, const char *t2)
{
	if (t1 == nullptr || t2 == nullptr) { return t1 == t2; }

	while (('\0' != *t1) && ('\0' != *t2))
	{
		t1 = skip_irrelevant_type_info(t1);
		t2 = skip_irrelevant_type_info(t2);
		// This is a really ugly hack.  For some stupid reason, the people
		// designing Objective-C type encodings decided to allow * as a
		// shorthand for char*, because strings are 'special'.  Unfortunately,
		// FSF GCC generates "*" for @encode(BOOL*), while Clang and Apple GCC
		// generate "^c" or "^C" (depending on whether BOOL is declared
		// unsigned).  
		//
		// The correct fix is to remove * completely from type encodings, but
		// unfortunately my time machine is broken so I can't travel to 1986
		// and apply a cluebat to those responsible.
		if ((*t1 == '*') && (*t2 != '*'))
		{
			if (*t2 == '^' && (((*(t2+1) == 'C') || (*(t2+1) == 'c'))))
			{
				t2++;
			}
			else
			{
				return NO;
			}
		}
		else if ((*t2 == '*') && (*t1 != '*'))
		{
			if (*t1 == '^' && (((*(t1+1) == 'C') || (*(t1+1) == 'c'))))
			{
				t1++;
			}
			else
			{
				return NO;
			}
		}
		else if (*t1 != *t2)
		{
			return NO;
		}

		if ('\0' != *t1) { t1++; }
		if ('\0' != *t2) { t2++; }
	}
	return YES;
}